

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadStore.hpp
# Opt level: O3

void InstructionSet::x86::Primitive::
     ld<(InstructionSet::x86::Source)11,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,write_t<uint16_t> destination,Context *context)

{
  Source SVar1;
  type_conflict2 tVar2;
  uint32_t uVar3;
  DataPointer pointer;
  
  SVar1 = instruction->mem_exts_source_;
  pointer.sib_.sib_ = SVar1 & BH | (Source)(instruction->source_data_dest_sib_ >> 2) & ~BH;
  pointer.source_ = "\x1f\x1f\x1f\x18"[SVar1 >> 3 & 3] & SVar1;
  uVar3 = address<unsigned_short,(InstructionSet::x86::AccessType)0,InstructionSet::x86::Instruction<false>const,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
                    (instruction,pointer,context);
  SVar1 = (Source)(instruction->source_data_dest_sib_ >> 10) & BH | ES;
  tVar2 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SVar1,(uint16_t)uVar3);
  *destination.target_ = tVar2;
  tVar2 = PCCompatible::Memory::access<unsigned_short,(InstructionSet::x86::AccessType)3>
                    (&context->memory,SVar1,(uint16_t)uVar3 + 2);
  (context->registers).ds_ = tVar2;
  return;
}

Assistant:

void ld(
	const InstructionT &instruction,
	write_t<uint16_t> destination,
	ContextT &context
) {
	const auto pointer = instruction.source();
	uint16_t source_address = uint16_t(address<uint16_t, AccessType::Read>(instruction, pointer, context));
	const Source source_segment = instruction.data_segment();

	context.memory.preauthorise_read(source_segment, source_address, 4);
	destination = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);
	source_address += 2;
	switch(selector) {
		case Source::DS:	context.registers.ds() = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);	break;
		case Source::ES:	context.registers.es() = context.memory.template access<uint16_t, AccessType::PreauthorisedRead>(source_segment, source_address);	break;
	}
}